

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermalizer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  RealType RVar1;
  double dVar2;
  int iVar3;
  SimInfo *info_00;
  ForceManager *this;
  DumpWriter *this_00;
  pointer *__ptr;
  undefined4 uVar4;
  undefined4 uVar5;
  SimInfo *local_168;
  double local_160;
  RealType local_158;
  Thermo thermo;
  SimInfo *info;
  string outputFileName;
  string inputFileName;
  SimCreator creator;
  gengetopt_args_info args_info;
  
  inputFileName._M_dataplus._M_p = (pointer)&inputFileName.field_2;
  inputFileName._M_string_length = 0;
  inputFileName.field_2._M_local_buf[0] = '\0';
  outputFileName._M_dataplus._M_p = (pointer)&outputFileName.field_2;
  outputFileName._M_string_length = 0;
  outputFileName.field_2._M_local_buf[0] = '\0';
  iVar3 = cmdline_parser(argc,argv,&args_info);
  if (iVar3 == 0) {
    if ((args_info.input_given == 0) && (args_info.inputs_num == 0)) {
      builtin_strncpy(painCave.errMsg,"No input file name was specified on the command line",0x35);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      std::__cxx11::string::assign((char *)&inputFileName);
    }
    std::__cxx11::string::assign((char *)&outputFileName);
    iVar3 = std::__cxx11::string::compare((string *)&outputFileName);
    if (iVar3 == 0) {
      builtin_strncpy(painCave.errMsg,"Input and Output File names should be different!",0x31);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    creator.mdFileName_._M_dataplus._M_p = (pointer)&creator.mdFileName_.field_2;
    creator._vptr_SimCreator = (_func_int **)&PTR__SimCreator_00276ff0;
    creator.mdFileName_._M_string_length = 0;
    creator.mdFileName_.field_2._M_local_buf[0] = '\0';
    info_00 = OpenMD::SimCreator::createSim(&creator,&inputFileName,true);
    thermo.info_ = info_00;
    std::make_unique<OpenMD::Velocitizer,OpenMD::SimInfo*&>(&local_168);
    this = (ForceManager *)operator_new(0xc80);
    OpenMD::ForceManager::ForceManager(this,info_00);
    OpenMD::Velocitizer::removeComDrift((Velocitizer *)local_168);
    (*this->_vptr_ForceManager[2])(this);
    RVar1 = OpenMD::Thermo::getPotential(&thermo);
    local_158 = OpenMD::Thermo::getKinetic(&thermo);
    (*info_00->sman_->_vptr_SnapshotManager[2])();
    this_00 = (DumpWriter *)operator_new(0x60);
    OpenMD::DumpWriter::DumpWriter(this_00,info_00,&outputFileName);
    if (args_info.temperature_given != 0) {
      uVar4 = SUB84(args_info.temperature_arg,0);
      uVar5 = (undefined4)((ulong)args_info.temperature_arg >> 0x20);
      if (args_info.temperature_arg < 0.0) {
        builtin_strncpy(painCave.errMsg,"Temperatures must be positive numbers.",0x27);
        painCave.isFatal = 1;
        painCave.severity = 1;
        local_160 = args_info.temperature_arg;
        simError();
        uVar4 = SUB84(local_160,0);
        uVar5 = (undefined4)((ulong)local_160 >> 0x20);
      }
      OpenMD::Velocitizer::randomize((Velocitizer *)local_168,(RealType)CONCAT44(uVar5,uVar4));
    }
    if (args_info.chargetemperature_given != 0) {
      uVar4 = SUB84(args_info.chargetemperature_arg,0);
      uVar5 = (undefined4)((ulong)args_info.chargetemperature_arg >> 0x20);
      if (args_info.chargetemperature_arg < 0.0) {
        builtin_strncpy(painCave.errMsg,"Temperatures must be positive numbers.",0x27);
        painCave.isFatal = 1;
        painCave.severity = 1;
        local_160 = args_info.chargetemperature_arg;
        simError();
        uVar4 = SUB84(local_160,0);
        uVar5 = (undefined4)((ulong)local_160 >> 0x20);
      }
      OpenMD::Velocitizer::randomizeChargeVelocity
                ((Velocitizer *)local_168,(RealType)CONCAT44(uVar5,uVar4));
    }
    if (args_info.energy_given != 0) {
      local_160 = args_info.energy_arg;
      if (RVar1 <= args_info.energy_arg) {
        if (local_158 < 1e-06) {
          OpenMD::Velocitizer::randomize((Velocitizer *)local_168,10.0);
          local_158 = OpenMD::Thermo::getKinetic(&thermo);
        }
        dVar2 = (local_160 - RVar1) / local_158;
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        OpenMD::Velocitizer::scale((Velocitizer *)local_168,dVar2);
      }
      else {
        builtin_strncpy(painCave.errMsg,"Energy must be larger than current potential energy.",0x35)
        ;
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
    }
    OpenMD::DumpWriter::writeDump(this_00);
    OpenMD::DumpWriter::~DumpWriter(this_00);
    operator_delete(this_00,0x60);
    snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",
             outputFileName._M_dataplus._M_p);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
    if (local_168 != (SimInfo *)0x0) {
      (*local_168->_vptr_SimInfo[1])();
    }
    OpenMD::SimCreator::~SimCreator(&creator);
    std::__cxx11::string::~string((string *)&outputFileName);
    std::__cxx11::string::~string((string *)&inputFileName);
    return 0;
  }
  cmdline_parser_print_help();
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {
  gengetopt_args_info args_info;
  std::string inputFileName;
  std::string outputFileName;

  // parse command line arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) {
    cmdline_parser_print_help();
    exit(1);
  }

  // get input file name
  if (args_info.input_given) {
    inputFileName = args_info.input_arg;
  } else {
    if (args_info.inputs_num) {
      inputFileName = args_info.inputs[0];
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "No input file name was specified on the command line");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  }

  // get output file name
  outputFileName = args_info.output_arg;

  if (!outputFileName.compare(inputFileName)) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Input and Output File names should be different!");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  // Parse the input file, set up the system, and read the last frame:
  SimCreator creator;
  SimInfo* info = creator.createSim(inputFileName, true);

  // Important utility classes for computing system properties:
  Thermo thermo(info);

  std::unique_ptr<Velocitizer> veloSet {std::make_unique<Velocitizer>(info)};

  ForceManager* forceMan = new ForceManager(info);

  // Just in case we were passed a system that is on the move:
  veloSet->removeComDrift();
  forceMan->calcForces();

  RealType instPE = thermo.getPotential();
  RealType instKE = thermo.getKinetic();

  // Now that we have the information from the current frame, advance
  // the snapshot to make a modified frame:
  info->getSnapshotManager()->advance();

  // Create DumpWriter to hold the modified frame:
  DumpWriter* writer = new DumpWriter(info, outputFileName);
  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "error in creating DumpWriter");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  // If resampling temperature, we call the randomizer method:
  if (args_info.temperature_given) {
    RealType temperature = args_info.temperature_arg;

    if (temperature < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Temperatures must be positive numbers.");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    veloSet->randomize(temperature);
  }

  // If resampling charge temperature, we call the randomizeChargeVelocity
  // method
  if (args_info.chargetemperature_given) {
    RealType charge_temperature = args_info.chargetemperature_arg;

    if (charge_temperature < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Temperatures must be positive numbers.");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    veloSet->randomizeChargeVelocity(charge_temperature);
  }

  // If scaling total energy, scale only the kinetic:
  if (args_info.energy_given) {
    RealType energy  = args_info.energy_arg;
    RealType epsilon = 1e-6;
    RealType lambda  = 0.0;

    if (energy < instPE) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Energy must be larger than current potential energy.");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    } else {
      if (instKE >= epsilon) {
        lambda = sqrt((energy - instPE) / instKE);
        veloSet->scale(lambda);
      }
      // If the current kinetic energy is close to zero, we will
      // sample velocities from a 10K distribution and then
      // subsequently scale from 10K to the desired energy.
      else {
        veloSet->randomize(10.0);
        instKE = thermo.getKinetic();
        lambda = sqrt((energy - instPE) / instKE);
        veloSet->scale(lambda);
      }
    }
  }

  writer->writeDump();
  // deleting the writer will put the closing at the end of the dump file.
  delete writer;

  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been generated.\n",
           outputFileName.c_str());
  painCave.isFatal  = 0;
  painCave.severity = OPENMD_INFO;
  simError();
  return 0;
}